

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void writePlannerStats(vector<PlannerStats,_std::allocator<PlannerStats>_> *s,FILE *fout)

{
  pointer pPVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  fprintf((FILE *)fout,"%%eps time expands cost\n");
  while( true ) {
    uVar3 = (ulong)uVar2;
    pPVar1 = (s->super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(s->super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar1 >> 5) <= uVar3) break;
    fprintf((FILE *)fout,"%f %f %d %d\n",pPVar1[uVar3].eps,pPVar1[uVar3].time,
            (ulong)(uint)pPVar1[uVar3].expands,(ulong)(uint)pPVar1[uVar3].cost);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void writePlannerStats(vector<PlannerStats> s, FILE* fout)
{
    fprintf(fout, "%%eps time expands cost\n");
    for (unsigned int i = 0; i < s.size(); i++) {
        fprintf(fout, "%f %f %d %d\n", s[i].eps, s[i].time, s[i].expands, s[i].cost);
    }
}